

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feed_forward.h
# Opt level: O0

void __thiscall
shift_window_transformer::FeedForward<float>::forward
          (FeedForward<float> *this,Tensor<float> *input,Tensor<float> *output)

{
  pointer *this_00;
  pointer *this_01;
  bool bVar1;
  iterator __first;
  iterator __last;
  reference pfVar2;
  float local_d8;
  float local_d4;
  iterator iStack_d0;
  float item;
  iterator __end0;
  iterator __begin0;
  Tensor<float> *__range2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a0;
  const_iterator local_98;
  undefined1 local_90 [8];
  Tensor<float> tmp2;
  undefined1 local_50 [8];
  Tensor<float> tmp1;
  Tensor<float> *output_local;
  Tensor<float> *input_local;
  FeedForward<float> *this_local;
  
  tmp1.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)output;
  Tensor<float>::Tensor((Tensor<float> *)local_50);
  (**(this->linear1->super_Layer<float>)._vptr_Layer)(this->linear1,input,(Tensor<float> *)local_50)
  ;
  Tensor<float>::Tensor((Tensor<float> *)local_90);
  this_00 = &tmp2.super_vector<float,_std::allocator<float>_>.
             super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  local_a0._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)this_00);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_98,
             &local_a0);
  this_01 = &tmp1.super_vector<float,_std::allocator<float>_>.
             super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  __first = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)this_01);
  __last = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)this_01)
  ;
  std::vector<int,std::allocator<int>>::
  insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)this_00,local_98,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current);
  __end0 = std::vector<float,_std::allocator<float>_>::begin
                     ((vector<float,_std::allocator<float>_> *)local_50);
  iStack_d0 = std::vector<float,_std::allocator<float>_>::end
                        ((vector<float,_std::allocator<float>_> *)local_50);
  while( true ) {
    bVar1 = __gnu_cxx::operator==<float_*,_std::vector<float,_std::allocator<float>_>_>
                      (&__end0,&stack0xffffffffffffff30);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pfVar2 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&__end0);
    local_d4 = *pfVar2;
    local_d8 = GELU<float>(local_d4);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_90,&local_d8);
    __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
              (&__end0);
  }
  (**(this->linear2->super_Layer<float>)._vptr_Layer)
            (this->linear2,local_90,
             tmp1.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  Tensor<float>::~Tensor((Tensor<float> *)local_90);
  Tensor<float>::~Tensor((Tensor<float> *)local_50);
  return;
}

Assistant:

void forward(const Tensor <T> &input, Tensor <T> &output) {
            Tensor<T> tmp1{};
            linear1->forward(input, tmp1);
            Tensor<T> tmp2{};
            tmp2.shape.insert(tmp2.shape.end(), tmp1.shape.begin(), tmp1.shape.end());
            for (auto item: tmp1) {
                tmp2.push_back(GELU(item));
            }
            linear2->forward(tmp2, output);
        }